

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_cnv.cpp
# Opt level: O3

void ucnv_toUWriteCodePoint_63
               (UConverter *cnv,UChar32 c,UChar **target,UChar *targetLimit,int32_t **offsets,
               int32_t sourceIndex,UErrorCode *pErrorCode)

{
  bool bVar1;
  UChar *pUVar2;
  int8_t iVar3;
  uint uVar4;
  long lVar5;
  int32_t *piVar6;
  
  pUVar2 = *target;
  if (targetLimit <= pUVar2) goto LAB_001b689d;
  if (c < 0x10000) {
    *pUVar2 = (UChar)c;
    c = 0xffffffff;
LAB_001b6873:
    lVar5 = 2;
    bVar1 = false;
  }
  else {
    *pUVar2 = (short)((uint)c >> 10) + L'ퟀ';
    c = c & 0x3ffU | 0xdc00;
    if (targetLimit <= pUVar2 + 1) goto LAB_001b6873;
    pUVar2[1] = (UChar)c;
    lVar5 = 4;
    bVar1 = true;
    c = 0xffffffff;
  }
  pUVar2 = (UChar *)((long)pUVar2 + lVar5);
  if ((offsets != (int32_t **)0x0) && (piVar6 = *offsets, piVar6 != (int32_t *)0x0)) {
    *piVar6 = sourceIndex;
    if (bVar1) {
      piVar6[1] = sourceIndex;
      piVar6 = piVar6 + 2;
    }
    else {
      piVar6 = piVar6 + 1;
    }
    *offsets = piVar6;
  }
LAB_001b689d:
  *target = pUVar2;
  if (-1 < c) {
    if (cnv != (UConverter *)0x0) {
      if ((uint)c < 0x10000) {
        iVar3 = '\x01';
        uVar4 = c;
      }
      else {
        uVar4 = ((uint)c >> 10) - 0x2840;
        cnv->UCharErrorBuffer[1] = (ushort)c & 0x3ff | 0xdc00;
        iVar3 = '\x02';
      }
      cnv->UCharErrorBuffer[0] = (UChar)uVar4;
      cnv->UCharErrorBufferLength = iVar3;
    }
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  return;
}

Assistant:

U_CFUNC void
ucnv_toUWriteCodePoint(UConverter *cnv,
                       UChar32 c,
                       UChar **target, const UChar *targetLimit,
                       int32_t **offsets,
                       int32_t sourceIndex,
                       UErrorCode *pErrorCode) {
    UChar *t;
    int32_t *o;

    t=*target;

    if(t<targetLimit) {
        if(c<=0xffff) {
            *t++=(UChar)c;
            c=U_SENTINEL;
        } else /* c is a supplementary code point */ {
            *t++=U16_LEAD(c);
            c=U16_TRAIL(c);
            if(t<targetLimit) {
                *t++=(UChar)c;
                c=U_SENTINEL;
            }
        }

        /* write offsets */
        if(offsets!=NULL && (o=*offsets)!=NULL) {
            *o++=sourceIndex;
            if((*target+1)<t) {
                *o++=sourceIndex;
            }
            *offsets=o;
        }
    }

    *target=t;

    /* write overflow from c */
    if(c>=0) {
        if(cnv!=NULL) {
            int8_t i=0;
            U16_APPEND_UNSAFE(cnv->UCharErrorBuffer, i, c);
            cnv->UCharErrorBufferLength=i;
        }
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
}